

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * GetFrontMostModalRootWindow(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *front_most_popup;
  int n;
  ImGuiContext *g;
  
  front_most_popup._4_4_ = (GImGui->OpenPopupStack).Size;
  do {
    front_most_popup._4_4_ = front_most_popup._4_4_ + -1;
    if (front_most_popup._4_4_ < 0) {
      return (ImGuiWindow *)0x0;
    }
    pIVar1 = (GImGui->OpenPopupStack).Data[front_most_popup._4_4_].Window;
  } while ((pIVar1 == (ImGuiWindow *)0x0) || ((pIVar1->Flags & 0x4000000U) == 0));
  return pIVar1;
}

Assistant:

static ImGuiWindow* GetFrontMostModalRootWindow()
{
    ImGuiContext& g = *GImGui;
    for (int n = g.OpenPopupStack.Size-1; n >= 0; n--)
        if (ImGuiWindow* front_most_popup = g.OpenPopupStack.Data[n].Window)
            if (front_most_popup->Flags & ImGuiWindowFlags_Modal)
                return front_most_popup;
    return NULL;
}